

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iidentity4_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  int local_9c;
  __m128i x;
  int i;
  __m128i scale;
  int16_t scale_fractional;
  __m128i *output_local;
  __m128i *input_local;
  
  for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
    auVar1._8_8_ = 0x3508350835083508;
    auVar1._0_8_ = 0x3508350835083508;
    auVar1 = pmulhrsw((undefined1  [16])input[local_9c],auVar1);
    alVar2 = (__m128i)paddsw(auVar1,(undefined1  [16])input[local_9c]);
    output[local_9c] = alVar2;
  }
  return;
}

Assistant:

static void iidentity4_ssse3(const __m128i *input, __m128i *output) {
  const int16_t scale_fractional = (NewSqrt2 - (1 << NewSqrt2Bits));
  const __m128i scale = _mm_set1_epi16(scale_fractional << (15 - NewSqrt2Bits));
  for (int i = 0; i < 4; ++i) {
    __m128i x = _mm_mulhrs_epi16(input[i], scale);
    output[i] = _mm_adds_epi16(x, input[i]);
  }
}